

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Type_create_subarray
              (int ndims,int *array_of_sizes,int *array_of_subsizes,int *array_of_starts,int ordder,
              MPIABI_Datatype oldtype,MPIABI_Datatype *newtype)

{
  int iVar1;
  ompi_datatype_t *poVar2;
  ompi_datatype_t **ppoVar3;
  WPI_HandlePtr<ompi_datatype_t_*> local_48;
  WPI_Handle local_40 [8];
  MPIABI_Datatype local_38;
  MPIABI_Datatype oldtype_local;
  int *piStack_28;
  int ordder_local;
  int *array_of_starts_local;
  int *array_of_subsizes_local;
  int *array_of_sizes_local;
  int ndims_local;
  
  local_38 = oldtype;
  oldtype_local._4_4_ = ordder;
  piStack_28 = array_of_starts;
  array_of_starts_local = array_of_subsizes;
  array_of_subsizes_local = array_of_sizes;
  array_of_sizes_local._4_4_ = ndims;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle((WPI_Handle<ompi_datatype_t_*> *)local_40,oldtype);
  poVar2 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_40);
  WPI_HandlePtr<ompi_datatype_t_*>::WPI_HandlePtr(&local_48,newtype);
  ppoVar3 = WPI_HandlePtr::operator_cast_to_ompi_datatype_t__((WPI_HandlePtr *)&local_48);
  iVar1 = MPI_Type_create_subarray
                    (ndims,array_of_sizes,array_of_subsizes,array_of_starts,ordder,poVar2,ppoVar3);
  WPI_HandlePtr<ompi_datatype_t_*>::~WPI_HandlePtr(&local_48);
  return iVar1;
}

Assistant:

int MPIABI_Type_create_subarray(
  int ndims,
  const int * array_of_sizes,
  const int * array_of_subsizes,
  const int * array_of_starts,
  int ordder,
  MPIABI_Datatype oldtype,
  MPIABI_Datatype * newtype
) {
  return MPI_Type_create_subarray(
    ndims,
    array_of_sizes,
    array_of_subsizes,
    array_of_starts,
    ordder,
    (MPI_Datatype)(WPI_Datatype)oldtype,
    (MPI_Datatype *)(WPI_DatatypePtr)newtype
  );
}